

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

int ov_time_seek(OggVorbis_File *vf,double seconds)

{
  double dVar1;
  ogg_int64_t target;
  double addsec;
  double time_total;
  ogg_int64_t pcm_total;
  int link;
  double seconds_local;
  OggVorbis_File *vf_local;
  
  time_total = 0.0;
  addsec = 0.0;
  if (vf->ready_state < 2) {
    vf_local._4_4_ = -0x83;
  }
  else if (vf->seekable == 0) {
    vf_local._4_4_ = -0x8a;
  }
  else if (0.0 <= seconds) {
    pcm_total._4_4_ = 0;
    for (; (pcm_total._4_4_ < vf->links &&
           (dVar1 = ov_time_total(vf,pcm_total._4_4_), addsec + dVar1 <= seconds));
        addsec = dVar1 + addsec) {
      time_total = (double)(vf->pcmlengths[pcm_total._4_4_ * 2 + 1] + (long)time_total);
      pcm_total._4_4_ = pcm_total._4_4_ + 1;
    }
    if (pcm_total._4_4_ == vf->links) {
      vf_local._4_4_ = -0x83;
    }
    else {
      vf_local._4_4_ =
           ov_pcm_seek(vf,(long)((seconds - addsec) * (double)vf->vi[pcm_total._4_4_].rate +
                                (double)(long)time_total));
    }
  }
  else {
    vf_local._4_4_ = -0x83;
  }
  return vf_local._4_4_;
}

Assistant:

int ov_time_seek(OggVorbis_File *vf,double seconds){
  /* translate time to PCM position and call ov_pcm_seek */

  int link=-1;
  ogg_int64_t pcm_total=0;
  double time_total=0.;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable)return(OV_ENOSEEK);
  if(seconds<0)return(OV_EINVAL);

  /* which bitstream section does this time offset occur in? */
  for(link=0;link<vf->links;link++){
    double addsec = ov_time_total(vf,link);
    if(seconds<time_total+addsec)break;
    time_total+=addsec;
    pcm_total+=vf->pcmlengths[link*2+1];
  }

  if(link==vf->links)return(OV_EINVAL);

  /* enough information to convert time offset to pcm offset */
  {
    ogg_int64_t target=pcm_total+(seconds-time_total)*vf->vi[link].rate;
    return(ov_pcm_seek(vf,target));
  }
}